

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptString::IsEnumerable(JavascriptString *this,PropertyId propertyId)

{
  BOOL BVar1;
  charcount_t cVar2;
  uint local_2c;
  ScriptContext *pSStack_28;
  charcount_t index;
  ScriptContext *scriptContext;
  JavascriptString *pJStack_18;
  PropertyId propertyId_local;
  JavascriptString *this_local;
  
  scriptContext._4_4_ = propertyId;
  pJStack_18 = this;
  pSStack_28 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_28,scriptContext._4_4_,&local_2c);
  if ((BVar1 == 0) || (cVar2 = GetLength(this), cVar2 <= local_2c)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptString::IsEnumerable(PropertyId propertyId)
    {
        ScriptContext* scriptContext = GetScriptContext();
        charcount_t index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (index < this->GetLength())
            {
                return true;
            }
        }
        return false;
    }